

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTests::init
          (ProgramInterfaceQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestNode *pTVar2;
  BufferBackedBlockInterfaceTestGroup *pBVar3;
  TestCaseGroup *group;
  ProgramInterfaceQueryTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "buffer_limited_query","Queries limited by the buffer size");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = (TestNode *)operator_new(0x78);
  anon_unknown_0::ResourceNameBufferLimitCase::ResourceNameBufferLimitCase
            ((ResourceNameBufferLimitCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "resource_name_query","Test GetProgramResourceName with too small a buffer");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  anon_unknown_0::ResourceQueryBufferLimitCase::ResourceQueryBufferLimitCase
            ((ResourceQueryBufferLimitCase *)pTVar2,(this->super_TestCaseGroup).m_context,
             "resource_query","Test GetProgramResourceiv with too small a buffer");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::UniformInterfaceTestGroup::UniformInterfaceTestGroup
            ((UniformInterfaceTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pBVar3 = (BufferBackedBlockInterfaceTestGroup *)operator_new(0x80);
  anon_unknown_0::BufferBackedBlockInterfaceTestGroup::BufferBackedBlockInterfaceTestGroup
            (pBVar3,(this->super_TestCaseGroup).m_context,STORAGE_UNIFORM);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::AtomicCounterTestGroup::AtomicCounterTestGroup
            ((AtomicCounterTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::ProgramInputTestGroup::ProgramInputTestGroup
            ((ProgramInputTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::ProgramOutputTestGroup::ProgramOutputTestGroup
            ((ProgramOutputTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::TransformFeedbackVaryingTestGroup::TransformFeedbackVaryingTestGroup
            ((TransformFeedbackVaryingTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_0::BufferVariableTestGroup::BufferVariableTestGroup
            ((BufferVariableTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pBVar3 = (BufferBackedBlockInterfaceTestGroup *)operator_new(0x80);
  anon_unknown_0::BufferBackedBlockInterfaceTestGroup::BufferBackedBlockInterfaceTestGroup
            (pBVar3,(this->super_TestCaseGroup).m_context,STORAGE_BUFFER);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar3);
  return extraout_EAX;
}

Assistant:

void ProgramInterfaceQueryTests::init (void)
{
	// Misc queries

	// .buffer_limited_query
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "buffer_limited_query", "Queries limited by the buffer size");

		addChild(group);

		group->addChild(new ResourceNameBufferLimitCase(m_context, "resource_name_query", "Test GetProgramResourceName with too small a buffer"));
		group->addChild(new ResourceQueryBufferLimitCase(m_context, "resource_query", "Test GetProgramResourceiv with too small a buffer"));
	}

	// Interfaces

	// .uniform
	addChild(new UniformInterfaceTestGroup(m_context));

	// .uniform_block
	addChild(new BufferBackedBlockInterfaceTestGroup(m_context, glu::STORAGE_UNIFORM));

	// .atomic_counter_buffer
	addChild(new AtomicCounterTestGroup(m_context));

	// .program_input
	addChild(new ProgramInputTestGroup(m_context));

	// .program_output
	addChild(new ProgramOutputTestGroup(m_context));

	// .transform_feedback_varying
	addChild(new TransformFeedbackVaryingTestGroup(m_context));

	// .buffer_variable
	addChild(new BufferVariableTestGroup(m_context));

	// .shader_storage_block
	addChild(new BufferBackedBlockInterfaceTestGroup(m_context, glu::STORAGE_BUFFER));
}